

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearPosition.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearPosition::ArchiveOUT
          (ChLinkMotorLinearPosition *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorLinearPosition>(marchive);
  ChLinkMotorLinear::ArchiveOUT(&this->super_ChLinkMotorLinear,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChLinkMotorLinearPosition::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorLinearPosition>();

    // serialize parent class
    ChLinkMotorLinear::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(pos_offset);
}